

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_hal.cpp
# Opt level: O0

MPP_RET mpp_hal_init(MppHal *ctx,MppHalCfg *cfg)

{
  uint uVar1;
  undefined8 *ptr;
  void *pvVar2;
  uint local_2c;
  MPP_RET ret;
  RK_U32 i;
  MppHalImpl *p;
  MppHalCfg *cfg_local;
  MppHal *ctx_local;
  
  if ((ctx == (MppHal *)0x0) || (cfg == (MppHalCfg *)0x0)) {
    _mpp_log_l(2,"mpp_hal","found NULL input ctx %p cfg %p\n","mpp_hal_init",ctx,cfg);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (MppHal)0x0;
    ptr = (undefined8 *)mpp_osal_calloc("mpp_hal_init",0x18);
    if (ptr == (undefined8 *)0x0) {
      _mpp_log_l(2,"mpp_hal","malloc failed\n","mpp_hal_init");
      ctx_local._4_4_ = MPP_ERR_MALLOC;
    }
    else {
      for (local_2c = 0; local_2c < 0xe; local_2c = local_2c + 1) {
        if ((cfg->type == hw_apis[local_2c]->type) && (cfg->coding == hw_apis[local_2c]->coding)) {
          ptr[1] = hw_apis[local_2c];
          pvVar2 = mpp_osal_calloc("mpp_hal_init",(ulong)*(uint *)(ptr[1] + 0x10));
          *ptr = pvVar2;
          uVar1 = (**(code **)(ptr[1] + 0x18))(*ptr,cfg);
          if (uVar1 == 0) {
            *ctx = ptr;
            return MPP_OK;
          }
          _mpp_log_l(2,"mpp_hal","hal %s init failed ret %d\n","mpp_hal_init",
                     hw_apis[local_2c]->name,(ulong)uVar1);
          break;
        }
      }
      _mpp_log_l(2,"mpp_hal","could not found coding type %d\n","mpp_hal_init",(ulong)cfg->coding);
      mpp_osal_free("mpp_hal_init",(void *)*ptr);
      mpp_osal_free("mpp_hal_init",ptr);
      ctx_local._4_4_ = MPP_NOK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_hal_init(MppHal *ctx, MppHalCfg *cfg)
{
    if (NULL == ctx || NULL == cfg) {
        mpp_err_f("found NULL input ctx %p cfg %p\n", ctx, cfg);
        return MPP_ERR_NULL_PTR;
    }
    *ctx = NULL;

    MppHalImpl *p = mpp_calloc(MppHalImpl, 1);
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_MALLOC;
    }

    RK_U32 i;
    for (i = 0; i < MPP_ARRAY_ELEMS(hw_apis); i++) {
        if (cfg->type   == hw_apis[i]->type &&
            cfg->coding == hw_apis[i]->coding) {
            p->api  = hw_apis[i];
            p->ctx  = mpp_calloc_size(void, p->api->ctx_size);

            MPP_RET ret = p->api->init(p->ctx, cfg);
            if (ret) {
                mpp_err_f("hal %s init failed ret %d\n", hw_apis[i]->name, ret);
                break;
            }

            *ctx = p;
            return MPP_OK;
        }
    }

    mpp_err_f("could not found coding type %d\n", cfg->coding);
    mpp_free(p->ctx);
    mpp_free(p);

    return MPP_NOK;
}